

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall bitfoot::Bitfoot::AddPawnCaps<false,true>(Bitfoot *this,uint64_t dests)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if ((dests != 0) && (this->pc[2] != 0)) {
    uVar6 = this->pc[2] << 7 & dests & this->pc[1] & 0x7f7f7f7f7f7f7f00;
    while (uVar6 != 0) {
      uVar1 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      if ((*(byte *)(&_board + uVar1) & 1) == 0) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb55,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      uVar6 = uVar6 & uVar6 - 1;
      iVar2 = (int)uVar1;
      iVar5 = iVar2 + -7;
      bVar3 = Pinned<false>(this,iVar5,iVar2);
      if (!bVar3) {
        iVar4 = ValueOf((&_board)[uVar1]);
        if (uVar1 < 0x38) {
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4,(&_board)[uVar1],0);
        }
        else {
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 0x3cf,(&_board)[uVar1],10);
          iVar4 = ValueOf((&_board)[uVar1]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 500,(&_board)[uVar1],8);
          iVar4 = ValueOf((&_board)[uVar1]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 0x140,(&_board)[uVar1],6);
          iVar4 = ValueOf((&_board)[uVar1]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 300,(&_board)[uVar1],4);
        }
      }
    }
    uVar6 = dests & this->pc[2] << 9 & this->pc[1] & 0xfefefefefefefe00;
    while (uVar6 != 0) {
      uVar1 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      if ((*(byte *)(&_board + uVar1) & 1) == 0) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb76,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      uVar6 = uVar6 & uVar6 - 1;
      iVar2 = (int)uVar1;
      iVar5 = iVar2 + -9;
      bVar3 = Pinned<false>(this,iVar5,iVar2);
      if (!bVar3) {
        iVar4 = ValueOf((&_board)[uVar1]);
        if (uVar1 < 0x38) {
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4,(&_board)[uVar1],0);
        }
        else {
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 0x3cf,(&_board)[uVar1],10);
          iVar4 = ValueOf((&_board)[uVar1]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 500,(&_board)[uVar1],8);
          iVar4 = ValueOf((&_board)[uVar1]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 0x140,(&_board)[uVar1],6);
          iVar4 = ValueOf((&_board)[uVar1]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar5,iVar2,iVar4 + 300,(&_board)[uVar1],4);
        }
      }
    }
  }
  return;
}

Assistant:

inline void AddPawnCaps(const uint64_t dests) {
    if (!dests || !pc[color|Pawn]) {
      return;
    }

    uint64_t dest;
    int from;
    int to;

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) >> 9) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) << 7) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthEast : SouthEast));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) >> 7) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) << 9) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthWest : SouthWest));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }
  }